

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::GB(GB *this,Buffer *rom_,Buffer *boot_rom_,Variant variant)

{
  Variant variant_local;
  Buffer *boot_rom__local;
  Buffer *rom__local;
  GB *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->rom,rom_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->boot_rom,boot_rom_);
  Cart::Cart(&this->cart,&this->rom,variant);
  State::State(&this->s,this);
  return;
}

Assistant:

GB::GB(Buffer&& rom_, Buffer&& boot_rom_, Variant variant)
    : rom(std::move(rom_)),
      boot_rom(std::move(boot_rom_)),
      cart(rom, variant),
      s(*this) {}